

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O1

label_t __thiscall re2c::CpgotoTable::max_label(CpgotoTable *this)

{
  bool bVar1;
  long lVar2;
  label_t max;
  label_t local_24;
  
  local_24 = label_t::first();
  lVar2 = 0;
  do {
    bVar1 = label_t::operator<(&local_24,&this->table[lVar2]->label);
    if (bVar1) {
      local_24.value = (this->table[lVar2]->label).value;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  return (label_t)local_24.value;
}

Assistant:

label_t CpgotoTable::max_label () const
{
	label_t max = label_t::first ();
	for (uint32_t i = 0; i < TABLE_SIZE; ++i)
	{
		if (max < table[i]->label)
		{
			max = table[i]->label;
		};
	}
	return max;
}